

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O2

void la_miam_core_v1_ack_format_text(la_vstring *vstr,void *data,int indent)

{
  void *pvVar1;
  
  if (*(ushort *)((long)data + 8) != 0) {
    la_miam_errors_format_text(vstr,(uint)*(ushort *)((long)data + 8),indent);
    return;
  }
  la_vstring_append_sprintf
            (vstr,"%*sPDU Length: %u\n",(ulong)(uint)indent,"",(ulong)*(uint *)((long)data + 0xc));
  la_vstring_append_sprintf(vstr,"%*sAircraft ID: %s\n",(ulong)(uint)indent,"",(long)data + 0x14);
  la_vstring_append_sprintf
            (vstr,"%*sMsg ACK num: %u\n",(ulong)(uint)indent,"",(ulong)*(byte *)((long)data + 0x1c))
  ;
  pvVar1 = la_dict_search(la_miam_core_v1_ack_format_text::v1_ack_xfer_result_names,
                          (uint)*(byte *)((long)data + 0x1d));
  if (pvVar1 != (void *)0x0) {
    la_vstring_append_sprintf(vstr,"%*sTransfer result: %s\n",(ulong)(uint)indent,"",pvVar1);
    return;
  }
  la_vstring_append_sprintf
            (vstr,"%*sTransfer result: unknown (%u)\n",(ulong)(uint)indent,"",
             (ulong)*(byte *)((long)data + 0x1d));
  return;
}

Assistant:

static void la_miam_core_v1_ack_format_text(la_vstring *vstr, void const *data, int indent) {
	la_assert(vstr != NULL);
	la_assert(data != NULL);
	la_assert(indent >= 0);

	static la_dict const v1_ack_xfer_result_names[] = {
		{ .id = 0x0, .val = "ack" },
		{ .id = 0x1, .val = "nack" },
		{ .id = 0x2, .val = "time_expiry" },
		{ .id = 0x3, .val = "peer_abort" },
		{ .id = 0x4, .val = "local_abort" },
		{ .id = 0x0, .val = NULL }
	};

	la_miam_core_v1_ack_pdu const *pdu = data;
	if(pdu->err & LA_MIAM_ERR_HDR) {
		la_miam_errors_format_text(vstr, pdu->err & LA_MIAM_ERR_HDR, indent);
		return;
	}
	LA_ISPRINTF(vstr, indent, "PDU Length: %u\n", pdu->pdu_len);
	LA_ISPRINTF(vstr, indent, "Aircraft ID: %s\n", pdu->aircraft_id);
	LA_ISPRINTF(vstr, indent, "Msg ACK num: %u\n", pdu->msg_ack_num);
	char *xfer_result_name = la_dict_search(v1_ack_xfer_result_names, pdu->ack_xfer_result);
	if(xfer_result_name != NULL) {
		LA_ISPRINTF(vstr, indent, "Transfer result: %s\n", xfer_result_name);
	} else {
		LA_ISPRINTF(vstr, indent, "Transfer result: unknown (%u)\n", pdu->ack_xfer_result);
	}
	// Not checking for body errors here, as there is no body in an ack PDU
}